

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFTiledPattern.cpp
# Opt level: O1

void __thiscall
PDFTiledPattern::PDFTiledPattern
          (PDFTiledPattern *this,DocumentContext *inDocumentContext,ObjectIDType inObjectID,
          PDFStream *inStream,ObjectIDType inResourcesDictionaryID)

{
  TiledPatternContentContext *this_00;
  
  ResourcesDictionary::ResourcesDictionary(&this->mResources);
  this->mObjectID = inObjectID;
  this->mResourcesDictionaryID = inResourcesDictionaryID;
  this->mContentStream = inStream;
  this_00 = (TiledPatternContentContext *)operator_new(0x70);
  TiledPatternContentContext::TiledPatternContentContext(this_00,inDocumentContext,this);
  this->mContentContext = this_00;
  return;
}

Assistant:

PDFTiledPattern::PDFTiledPattern(PDFHummus::DocumentContext* inDocumentContext,ObjectIDType inObjectID, PDFStream* inStream, ObjectIDType inResourcesDictionaryID)
{
	mObjectID = inObjectID;
	mResourcesDictionaryID = inResourcesDictionaryID;
	mContentStream = inStream;
	mContentContext = new TiledPatternContentContext(inDocumentContext, this);
}